

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void duckdb::UnionVector::SetToMember
               (Vector *union_vector,union_tag_t tag,Vector *member_vector,idx_t count,
               bool keep_tags_for_null)

{
  buffer_ptr<ValidityBuffer> *other;
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Vector *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t iVar8;
  idx_t iVar9;
  undefined7 in_register_00000031;
  ulong member_index;
  ulong uVar10;
  bool bVar11;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  member_index = CONCAT71(in_register_00000031,tag) & 0xffffffff;
  pVVar6 = GetMember(union_vector,member_index);
  Vector::Reference(pVVar6,member_vector);
  pVVar6 = GetTags(union_vector);
  if (member_vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(union_vector,CONSTANT_VECTOR);
    *pVVar6->data = tag;
    if (keep_tags_for_null) {
      puVar2 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 != (unsigned_long *)0x0) {
        *(byte *)puVar2 = (byte)*puVar2 | 1;
      }
      puVar2 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 != (unsigned_long *)0x0) {
        *(byte *)puVar2 = (byte)*puVar2 | 1;
      }
    }
    else {
      puVar2 = (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = (*puVar2 & 1) == 0;
      }
      ConstantVector::SetNull(union_vector,bVar11);
      puVar2 = (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar11 = false;
      }
      else {
        bVar11 = (*puVar2 & 1) == 0;
      }
      ConstantVector::SetNull(pVVar6,bVar11);
    }
  }
  else {
    Vector::Flatten(member_vector,count);
    Vector::SetVectorType(union_vector,FLAT_VECTOR);
    if ((member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      Vector::SetVectorType(pVVar6,CONSTANT_VECTOR);
      *pVVar6->data = tag;
    }
    else {
      Vector::SetVectorType(pVVar6,FLAT_VECTOR);
      if (keep_tags_for_null) {
        FlatVector::VerifyFlatVector(pVVar6);
        if ((pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_48,&local_38);
          p_Var5 = p_Stack_40;
          peVar4 = local_48;
          local_48 = (element_type *)0x0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        if (count != 0) {
          uVar10 = count + 0x3f >> 6;
          if (uVar10 != 1) {
            switchD_00570541::default
                      ((pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
                       0xff,uVar10 * 8 - 8);
          }
          puVar1 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar10 - 1);
          *puVar1 = *puVar1 | -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
        }
        FlatVector::VerifyFlatVector(union_vector);
        if ((union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_48,&local_38);
          p_Var5 = p_Stack_40;
          peVar4 = local_48;
          local_48 = (element_type *)0x0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var3 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                   .internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
          .
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
          .
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(union_vector->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        if (count != 0) {
          uVar10 = count + 0x3f >> 6;
          if (uVar10 != 1) {
            switchD_00570541::default
                      ((union_vector->validity).super_TemplatedValidityMask<unsigned_long>.
                       validity_mask,0xff,uVar10 * 8 - 8);
          }
          puVar1 = (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                   + (uVar10 - 1);
          *puVar1 = *puVar1 | -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
        }
      }
      else {
        FlatVector::VerifyFlatVector(member_vector);
        FlatVector::VerifyFlatVector(union_vector);
        (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        other = &(member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(union_vector->validity).super_TemplatedValidityMask<unsigned_long>.
                    validity_data,other);
        (union_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        FlatVector::VerifyFlatVector(member_vector);
        FlatVector::VerifyFlatVector(pVVar6);
        (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   other);
        (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      }
      switchD_00570541::default(pVVar6->data,(uint)tag,count);
    }
  }
  iVar8 = UnionType::GetMemberCount(&union_vector->type);
  if (iVar8 != 0) {
    iVar8 = 0;
    do {
      if (member_index != iVar8) {
        pVVar6 = GetMember(union_vector,iVar8);
        Vector::SetVectorType(pVVar6,CONSTANT_VECTOR);
        ConstantVector::SetNull(pVVar6,true);
      }
      iVar8 = iVar8 + 1;
      iVar9 = UnionType::GetMemberCount(&union_vector->type);
    } while (iVar8 < iVar9);
  }
  return;
}

Assistant:

void UnionVector::SetToMember(Vector &union_vector, union_tag_t tag, Vector &member_vector, idx_t count,
                              bool keep_tags_for_null) {
	D_ASSERT(union_vector.GetType().id() == LogicalTypeId::UNION);
	D_ASSERT(tag < UnionType::GetMemberCount(union_vector.GetType()));

	// Set the union member to the specified vector
	UnionVector::GetMember(union_vector, tag).Reference(member_vector);
	auto &tag_vector = UnionVector::GetTags(union_vector);

	if (member_vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// if the member vector is constant, we can set the union to constant as well
		union_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<union_tag_t>(tag_vector)[0] = tag;
		if (keep_tags_for_null) {
			ConstantVector::SetNull(union_vector, false);
			ConstantVector::SetNull(tag_vector, false);
		} else {
			ConstantVector::SetNull(union_vector, ConstantVector::IsNull(member_vector));
			ConstantVector::SetNull(tag_vector, ConstantVector::IsNull(member_vector));
		}

	} else {
		// otherwise flatten and set to flatvector
		member_vector.Flatten(count);
		union_vector.SetVectorType(VectorType::FLAT_VECTOR);

		if (member_vector.validity.AllValid()) {
			// if the member vector is all valid, we can set the tag to constant
			tag_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto tag_data = ConstantVector::GetData<union_tag_t>(tag_vector);
			*tag_data = tag;
		} else {
			tag_vector.SetVectorType(VectorType::FLAT_VECTOR);
			if (keep_tags_for_null) {
				FlatVector::Validity(tag_vector).SetAllValid(count);
				FlatVector::Validity(union_vector).SetAllValid(count);
			} else {
				// ensure the tags have the same validity as the member
				FlatVector::Validity(union_vector) = FlatVector::Validity(member_vector);
				FlatVector::Validity(tag_vector) = FlatVector::Validity(member_vector);
			}

			auto tag_data = FlatVector::GetData<union_tag_t>(tag_vector);
			memset(tag_data, tag, count);
		}
	}

	// Set the non-selected members to constant null vectors
	for (idx_t i = 0; i < UnionType::GetMemberCount(union_vector.GetType()); i++) {
		if (i != tag) {
			auto &member = UnionVector::GetMember(union_vector, i);
			member.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(member, true);
		}
	}
}